

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall SpiSimulationDataGenerator::CreateSpiTransaction(SpiSimulationDataGenerator *this)

{
  U64 UVar1;
  U64 UVar2;
  
  if (this->mEnable != (SimulationChannelDescriptor *)0x0) {
    SimulationChannelDescriptor::Transition();
  }
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x20);
  UVar2 = this->mValue;
  if (this->mSettings->mDataValidEdge == LeadingEdge) {
    OutputWord_CPHA0(this,UVar2,UVar2 + 1);
    UVar1 = this->mValue;
    UVar2 = UVar1 + 1;
    this->mValue = UVar2;
    OutputWord_CPHA0(this,UVar2,UVar1 + 2);
    UVar1 = this->mValue;
    UVar2 = UVar1 + 1;
    this->mValue = UVar2;
    OutputWord_CPHA0(this,UVar2,UVar1 + 2);
    UVar2 = this->mValue + 1;
    this->mValue = UVar2;
    if (this->mEnable != (SimulationChannelDescriptor *)0x0) {
      SimulationChannelDescriptor::Transition();
      UVar2 = this->mValue;
    }
    OutputWord_CPHA0(this,UVar2,UVar2 + 1);
  }
  else {
    OutputWord_CPHA1(this,UVar2,UVar2 + 1);
    UVar1 = this->mValue;
    UVar2 = UVar1 + 1;
    this->mValue = UVar2;
    OutputWord_CPHA1(this,UVar2,UVar1 + 2);
    UVar1 = this->mValue;
    UVar2 = UVar1 + 1;
    this->mValue = UVar2;
    OutputWord_CPHA1(this,UVar2,UVar1 + 2);
    UVar2 = this->mValue + 1;
    this->mValue = UVar2;
    if (this->mEnable != (SimulationChannelDescriptor *)0x0) {
      SimulationChannelDescriptor::Transition();
      UVar2 = this->mValue;
    }
    OutputWord_CPHA1(this,UVar2,UVar2 + 1);
  }
  this->mValue = this->mValue + 1;
  return;
}

Assistant:

void SpiSimulationDataGenerator::CreateSpiTransaction()
{
    if( mEnable != NULL )
        mEnable->Transition();

    mSpiSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2.0 ) );

    if( mSettings->mDataValidEdge == AnalyzerEnums::LeadingEdge )
    {
        OutputWord_CPHA0( mValue, mValue + 1 );
        mValue++;

        OutputWord_CPHA0( mValue, mValue + 1 );
        mValue++;

        OutputWord_CPHA0( mValue, mValue + 1 );
        mValue++;

        if( mEnable != NULL )
            mEnable->Transition();

        OutputWord_CPHA0( mValue, mValue + 1 );
        mValue++;
    }
    else
    {
        OutputWord_CPHA1( mValue, mValue + 1 );
        mValue++;

        OutputWord_CPHA1( mValue, mValue + 1 );
        mValue++;

        OutputWord_CPHA1( mValue, mValue + 1 );
        mValue++;

        if( mEnable != NULL )
            mEnable->Transition();

        OutputWord_CPHA1( mValue, mValue + 1 );
        mValue++;
    }
}